

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

Token * __thiscall Lexer::match_digit(Token *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  ostream *poVar2;
  lexer_exception *this_00;
  bool local_29a;
  string local_278;
  allocator local_251;
  string local_250 [32];
  Position local_230;
  TokenPosition local_220;
  Type local_208 [2];
  Position local_200;
  TokenPosition local_1f0;
  Type local_1d8;
  int local_1d4;
  undefined1 local_1d0 [4];
  int length;
  string res;
  stringstream local_1a0 [8];
  stringstream buffer;
  ostream local_190 [376];
  Lexer *local_18;
  Lexer *this_local;
  
  local_18 = this;
  this_local = (Lexer *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  do {
    std::operator<<(local_190,this->current_);
    res.field_2._M_local_buf[0xb] = '\0';
    consume(this,(bool *)(res.field_2._M_local_buf + 0xb));
    bVar1 = Recognition::is_digit(&this->current_);
    local_29a = true;
    if (!bVar1) {
      local_29a = Recognition::is_dot(&this->current_);
    }
  } while (local_29a != false);
  std::__cxx11::stringstream::str();
  local_1d4 = std::__cxx11::string::length();
  bVar1 = Recognition::is_integer((string *)local_1d0);
  if (bVar1) {
    local_1d8 = kIntegerLiteral;
    Position::Position(&local_200,&(this->position_).super_Position);
    TokenPosition::TokenPosition(&local_1f0,&local_200,local_1d4);
    Token::Token(__return_storage_ptr__,&local_1d8,(string *)local_1d0,&local_1f0);
  }
  else {
    bVar1 = Recognition::is_real((string *)local_1d0);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_250,"",&local_251);
      std::__cxx11::stringstream::str((string *)local_1a0);
      std::__cxx11::string::~string(local_250);
      std::allocator<char>::~allocator((allocator<char> *)&local_251);
      poVar2 = std::operator<<(local_190,anon_var_dwarf_32716);
      poVar2 = std::operator<<(poVar2,(string *)local_1d0);
      std::operator<<(poVar2,"\"");
      this_00 = (lexer_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      lexer_exception::lexer_exception(this_00,&this->position_,&local_278);
      __cxa_throw(this_00,&lexer_exception::typeinfo,lexer_exception::~lexer_exception);
    }
    local_208[0] = kRealLiteral;
    Position::Position(&local_230,&(this->position_).super_Position);
    TokenPosition::TokenPosition(&local_220,&local_230,local_1d4);
    Token::Token(__return_storage_ptr__,local_208,(string *)local_1d0,&local_220);
  }
  local_208[1] = 1;
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::match_digit() {
    std::stringstream buffer;
    do {
        buffer << current_;
        consume(false);
    } while (Recognition::is_digit(current_) || Recognition::is_dot(current_));

    std::string res = buffer.str();
    int length = (int)res.length();
    if (Recognition::is_integer(res)) {
        return Token(Token::Type::kIntegerLiteral, res, TokenPosition(position_, length));
    } else if (Recognition::is_real(res)) {
        return Token(Token::Type::kRealLiteral, res, TokenPosition(position_, length));
    } else {
        buffer.str("");
        buffer << "不正确的数字: \"" << res << "\"";
        throw lexer_exception(position_, buffer.str());
    }
}